

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t _elemsize;
  int *piVar5;
  float fVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  int _w;
  int _h;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Option *opt_00;
  ulong uVar22;
  int w_tiles;
  Mat *dst;
  long lVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  long local_510;
  Mat local_4d8;
  Mat *local_488;
  ulong local_480;
  Mat local_478;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  ulong local_3f8;
  void *local_3f0;
  long local_3e8;
  ulong local_3e0;
  undefined1 local_3d8 [64];
  size_t local_398 [2];
  Mat local_388;
  float afStack_338 [194];
  
  iVar25 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar18 = bottom_blob->elempack;
  iVar26 = top_blob->w;
  iVar19 = top_blob->h;
  iVar21 = top_blob->c;
  piVar5 = bottom_blob->refcount;
  local_478.data = bottom_blob->data;
  local_478.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_478.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_478.elemsize._0_4_ = (undefined4)_elemsize;
  local_478.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_478.allocator = bottom_blob->allocator;
  iVar20 = bottom_blob->h;
  iVar17 = bottom_blob->w;
  uVar9 = bottom_blob->dims;
  uVar10 = bottom_blob->w;
  uVar11 = bottom_blob->h;
  uVar12 = bottom_blob->d;
  local_478.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    iVar17 = bottom_blob->w;
    iVar20 = bottom_blob->h;
  }
  iVar26 = (iVar26 + 5) / 6;
  _w = iVar26 * 6;
  iVar19 = (iVar19 + 5) / 6;
  _h = iVar19 * 6;
  local_488 = top_blob;
  local_478.elempack = iVar18;
  local_478.dims = uVar9;
  local_478.w = uVar10;
  local_478.h = uVar11;
  local_478.d = uVar12;
  local_478.c = iVar25;
  copy_make_border(bottom_blob,&local_478,0,(_h - iVar20) + 2,0,(_w - iVar17) + 2,0,0.0,opt);
  local_388.cstep = 0;
  local_388.data = (void *)0x0;
  local_388.refcount._0_4_ = 0;
  local_388.refcount._4_4_ = 0;
  local_388.elemsize._0_4_ = 0;
  local_388._20_8_ = 0;
  local_388.allocator = (Allocator *)0x0;
  local_388.dims = 0;
  local_388.w = 0;
  local_388.h = 0;
  local_388.d = 0;
  local_388.c = 0;
  Mat::create(&local_388,iVar19 * iVar26,0x40,iVar25,_elemsize,iVar18,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack4_sse(&local_478,&local_388,opt_00);
  dst = local_488;
  piVar5 = (int *)CONCAT44(local_478.refcount._4_4_,local_478.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_478.allocator == (Allocator *)0x0) {
        if (local_478.data != (void *)0x0) {
          free(local_478.data);
        }
      }
      else {
        (*(local_478.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_478.cstep = 0;
  local_478.data = (void *)0x0;
  local_478.refcount._0_4_ = 0;
  local_478.refcount._4_4_ = 0;
  local_478.elemsize._0_4_ = 0;
  local_478.elemsize._4_4_ = 0;
  local_478.elempack = 0;
  local_478.h = 0;
  local_478.d = 0;
  local_478.c = 0;
  local_478.allocator = (Allocator *)0x0;
  local_478.dims = 0;
  local_478.w = 0;
  local_398[0] = 0;
  local_3d8._0_8_ = (void *)0x0;
  local_3d8._8_4_ = 0;
  local_3d8._12_4_ = 0;
  local_3d8._16_4_ = 0;
  local_3d8._20_4_ = 0;
  local_3d8._24_4_ = 0;
  local_3d8._32_8_ = (Allocator *)0x0;
  local_3d8._40_4_ = 0;
  local_3d8._44_4_ = 0;
  local_3d8._48_4_ = 0;
  local_3d8._52_4_ = 0;
  local_3d8._56_4_ = 0;
  convolution_winograd_dot_pack4_sse(&local_388,iVar21,kernel_tm,(Mat *)local_3d8,opt);
  local_4d8.cstep = 0;
  local_4d8.data = (void *)0x0;
  local_4d8.refcount._0_4_ = 0;
  local_4d8.refcount._4_4_ = 0;
  local_4d8.elemsize._0_4_ = 0;
  local_4d8.elemsize._4_4_ = 0;
  local_4d8.elempack = 0;
  local_4d8.allocator = (Allocator *)0x0;
  local_4d8.dims = 0;
  local_4d8.w = 0;
  local_4d8.h = 0;
  local_4d8.d = 0;
  local_4d8.c = 0;
  if ((_w == dst->w) && (_h == dst->h)) {
    if (&local_4d8 == dst) {
      iVar26 = 0;
      iVar19 = 0;
      goto LAB_00255c10;
    }
    piVar5 = dst->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_4d8.data = dst->data;
    local_4d8.refcount._0_4_ = SUB84(dst->refcount,0);
    local_4d8.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_4d8.elemsize._0_4_ = (undefined4)dst->elemsize;
    local_4d8.elemsize._4_4_ = (undefined4)(dst->elemsize >> 0x20);
    local_4d8.elempack = dst->elempack;
    local_4d8.allocator = dst->allocator;
    uVar13 = dst->dims;
    uVar14 = dst->w;
    uVar15 = dst->h;
    uVar16 = dst->d;
    local_4d8.c = dst->c;
    local_4d8.cstep = dst->cstep;
    iVar25 = dst->w;
    iVar18 = dst->h;
    local_4d8.dims = uVar13;
    local_4d8.w = uVar14;
    local_4d8.h = uVar15;
    local_4d8.d = uVar16;
  }
  else {
    Mat::create(&local_4d8,_w,_h,iVar21,_elemsize,iVar18,opt->workspace_allocator);
    iVar25 = local_4d8.w;
    iVar18 = local_4d8.h;
  }
  iVar26 = iVar25;
  iVar19 = iVar18;
  if (0 < local_4d8.c) {
    local_3f0 = bias->data;
    local_3e0 = (ulong)(uint)(iVar18 / 6);
    uVar8 = iVar25 / 6;
    iVar21 = uVar8 * (iVar18 / 6);
    local_3f8 = (ulong)(uint)local_4d8.c;
    local_3e8 = (ulong)uVar8 * 0x10;
    local_400 = (long)(iVar21 * 4) * 4;
    local_408 = (long)(iVar21 * 8) * 4;
    local_410 = (long)(iVar21 * 0xc) * 4;
    local_418 = (long)(iVar21 * 0x10) * 4;
    local_420 = (long)(iVar21 * 0x14) * 4;
    local_428 = (long)(iVar21 * 0x18) * 4;
    local_430 = (long)(iVar21 * 0x1c) * 4;
    uVar24 = 0;
    do {
      local_480 = uVar24;
      if (local_3f0 == (void *)0x0) {
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
      }
      else {
        pfVar1 = (float *)((long)local_3f0 + local_480 * 0x10);
        fVar32 = *pfVar1;
        fVar33 = pfVar1[1];
        fVar34 = pfVar1[2];
        fVar35 = pfVar1[3];
      }
      if (5 < iVar18) {
        lVar31 = CONCAT44(local_3d8._20_4_,local_3d8._16_4_) * local_398[0] * local_480;
        lVar30 = (long)local_4d8.data +
                 local_4d8.cstep * CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize)
                 * local_480 + 0x50;
        local_510 = 0;
        uVar24 = 0;
        do {
          if (5 < iVar25) {
            uVar22 = 0;
            lVar27 = local_510;
            do {
              lVar23 = -0x80;
              lVar28 = lVar27;
              do {
                auVar37 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_400 + lVar31);
                auVar42 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_408 + lVar31);
                auVar46 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_410 + lVar31);
                auVar3 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_418 + lVar31);
                auVar61 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_420 + lVar31);
                auVar4 = *(undefined1 (*) [16])(local_3d8._0_8_ + lVar28 + local_428 + lVar31);
                fVar62 = auVar42._0_4_ + auVar37._0_4_;
                fVar63 = auVar42._4_4_ + auVar37._4_4_;
                fVar64 = auVar42._8_4_ + auVar37._8_4_;
                fVar65 = auVar42._12_4_ + auVar37._12_4_;
                auVar37 = vsubps_avx(auVar37,auVar42);
                fVar41 = auVar3._0_4_ + auVar46._0_4_;
                fVar43 = auVar3._4_4_ + auVar46._4_4_;
                fVar44 = auVar3._8_4_ + auVar46._8_4_;
                fVar45 = auVar3._12_4_ + auVar46._12_4_;
                auVar42 = vsubps_avx(auVar46,auVar3);
                fVar47 = auVar4._0_4_ + auVar61._0_4_;
                fVar50 = auVar4._4_4_ + auVar61._4_4_;
                fVar53 = auVar4._8_4_ + auVar61._8_4_;
                fVar54 = auVar4._12_4_ + auVar61._12_4_;
                auVar46 = vsubps_avx(auVar61,auVar4);
                pfVar1 = (float *)(local_3d8._0_8_ + lVar28 + lVar31);
                fVar55 = pfVar1[1];
                fVar57 = pfVar1[2];
                fVar59 = pfVar1[3];
                fVar48 = auVar42._0_4_;
                fVar49 = auVar42._4_4_;
                fVar51 = auVar42._8_4_;
                fVar52 = auVar42._12_4_;
                fVar56 = auVar37._0_4_;
                fVar58 = auVar37._4_4_;
                fVar60 = auVar37._8_4_;
                fVar6 = auVar37._12_4_;
                pfVar2 = (float *)(local_3d8._0_8_ + lVar28 + local_430 + lVar31);
                fVar36 = *pfVar2;
                fVar38 = pfVar2[1];
                fVar39 = pfVar2[2];
                fVar40 = pfVar2[3];
                *(float *)((long)afStack_338 + lVar23 + 0x80) =
                     fVar62 + *pfVar1 + fVar47 * 32.0 + fVar41;
                *(float *)((long)afStack_338 + lVar23 + 0x84) =
                     fVar63 + fVar55 + fVar50 * 32.0 + fVar43;
                *(float *)((long)afStack_338 + lVar23 + 0x88) =
                     fVar64 + fVar57 + fVar53 * 32.0 + fVar44;
                *(float *)((long)afStack_338 + lVar23 + 0x8c) =
                     fVar65 + fVar59 + fVar54 * 32.0 + fVar45;
                *(float *)((long)afStack_338 + lVar23 + 0x180) =
                     fVar41 * 4.0 + fVar62 + fVar47 * 8.0;
                *(float *)((long)afStack_338 + lVar23 + 0x184) =
                     fVar43 * 4.0 + fVar63 + fVar50 * 8.0;
                *(float *)((long)afStack_338 + lVar23 + 0x188) =
                     fVar44 * 4.0 + fVar64 + fVar53 * 8.0;
                *(float *)((long)afStack_338 + lVar23 + 0x18c) =
                     fVar45 * 4.0 + fVar65 + fVar54 * 8.0;
                *(float *)((long)afStack_338 + lVar23 + 0x280) =
                     fVar62 + fVar47 + fVar47 + fVar41 * 16.0;
                *(float *)((long)afStack_338 + lVar23 + 0x284) =
                     fVar63 + fVar50 + fVar50 + fVar43 * 16.0;
                *(float *)((long)afStack_338 + lVar23 + 0x288) =
                     fVar64 + fVar53 + fVar53 + fVar44 * 16.0;
                *(float *)((long)afStack_338 + lVar23 + 0x28c) =
                     fVar65 + fVar54 + fVar54 + fVar45 * 16.0;
                fVar55 = auVar46._0_4_;
                fVar57 = auVar46._4_4_;
                fVar59 = auVar46._8_4_;
                fVar41 = auVar46._12_4_;
                *(float *)((long)afStack_338 + lVar23 + 0x100) =
                     fVar55 * 16.0 + fVar48 + fVar48 + fVar56;
                *(float *)((long)afStack_338 + lVar23 + 0x104) =
                     fVar57 * 16.0 + fVar49 + fVar49 + fVar58;
                *(float *)((long)afStack_338 + lVar23 + 0x108) =
                     fVar59 * 16.0 + fVar51 + fVar51 + fVar60;
                *(float *)((long)afStack_338 + lVar23 + 0x10c) =
                     fVar41 * 16.0 + fVar52 + fVar52 + fVar6;
                *(float *)((long)afStack_338 + lVar23 + 0x200) =
                     fVar48 * 8.0 + fVar56 + fVar55 * 4.0;
                *(float *)((long)afStack_338 + lVar23 + 0x204) =
                     fVar49 * 8.0 + fVar58 + fVar57 * 4.0;
                *(float *)((long)afStack_338 + lVar23 + 0x208) =
                     fVar51 * 8.0 + fVar60 + fVar59 * 4.0;
                *(float *)((long)afStack_338 + lVar23 + 0x20c) = fVar52 * 8.0 + fVar6 + fVar41 * 4.0
                ;
                *(float *)((long)afStack_338 + lVar23 + 0x300) =
                     fVar48 * 32.0 + fVar56 + fVar36 + fVar55;
                *(float *)((long)afStack_338 + lVar23 + 0x304) =
                     fVar49 * 32.0 + fVar58 + fVar38 + fVar57;
                *(float *)(&stack0xffffffffffffffd0 + lVar23) =
                     fVar51 * 32.0 + fVar60 + fVar39 + fVar59;
                *(float *)(&stack0xffffffffffffffd4 + lVar23) =
                     fVar52 * 32.0 + fVar6 + fVar40 + fVar41;
                lVar28 = lVar28 + (long)(iVar21 * 0x20) * 4;
                lVar23 = lVar23 + 0x10;
              } while (lVar23 != 0);
              pauVar29 = (undefined1 (*) [16])(((long)((uVar22 << 0x23) * 3) >> 0x1e) + lVar30);
              lVar28 = 0x70;
              do {
                auVar37 = *(undefined1 (*) [16])((long)local_398 + lVar28);
                auVar42 = *(undefined1 (*) [16])((long)&local_388.data + lVar28);
                auVar46 = *(undefined1 (*) [16])((long)&local_388.elemsize + lVar28);
                auVar3 = *(undefined1 (*) [16])((long)&local_388.allocator + lVar28);
                auVar61 = *(undefined1 (*) [16])((long)&local_388.h + lVar28);
                auVar4 = *(undefined1 (*) [16])((long)&local_388.cstep + lVar28);
                auVar7 = vsubps_avx(auVar37,auVar42);
                fVar62 = auVar3._0_4_ + auVar46._0_4_;
                fVar63 = auVar3._4_4_ + auVar46._4_4_;
                fVar64 = auVar3._8_4_ + auVar46._8_4_;
                fVar65 = auVar3._12_4_ + auVar46._12_4_;
                auVar46 = vsubps_avx(auVar46,auVar3);
                fVar48 = auVar4._0_4_ + auVar61._0_4_;
                fVar51 = auVar4._4_4_ + auVar61._4_4_;
                fVar47 = auVar4._8_4_ + auVar61._8_4_;
                fVar53 = auVar4._12_4_ + auVar61._12_4_;
                auVar3 = vsubps_avx(auVar61,auVar4);
                fVar36 = auVar37._0_4_ + fVar32 + auVar42._0_4_;
                fVar38 = auVar37._4_4_ + fVar33 + auVar42._4_4_;
                fVar39 = auVar37._8_4_ + fVar34 + auVar42._8_4_;
                fVar40 = auVar37._12_4_ + fVar35 + auVar42._12_4_;
                fVar56 = *(float *)(local_3d8 + lVar28 + 0x34);
                fVar58 = *(float *)(local_3d8 + lVar28 + 0x38);
                fVar60 = *(float *)(local_3d8 + lVar28 + 0x3c);
                auVar61._0_4_ = fVar62 * 4.0 + fVar36 + fVar48 * 8.0;
                auVar61._4_4_ = fVar63 * 4.0 + fVar38 + fVar51 * 8.0;
                auVar61._8_4_ = fVar64 * 4.0 + fVar39 + fVar47 * 8.0;
                auVar61._12_4_ = fVar65 * 4.0 + fVar40 + fVar53 * 8.0;
                fVar49 = auVar7._0_4_ + fVar32;
                fVar52 = auVar7._4_4_ + fVar33;
                fVar50 = auVar7._8_4_ + fVar34;
                fVar54 = auVar7._12_4_ + fVar35;
                fVar41 = auVar46._0_4_;
                fVar43 = auVar46._4_4_;
                fVar44 = auVar46._8_4_;
                fVar45 = auVar46._12_4_;
                fVar6 = *(float *)((long)afStack_338 + lVar28);
                fVar55 = *(float *)((long)afStack_338 + lVar28 + 4);
                fVar57 = *(float *)((long)afStack_338 + lVar28 + 8);
                fVar59 = *(float *)((long)afStack_338 + lVar28 + 0xc);
                *(float *)pauVar29[-5] =
                     fVar62 + fVar48 * 32.0 + fVar36 + *(float *)(local_3d8 + lVar28 + 0x30);
                *(float *)(pauVar29[-5] + 4) = fVar63 + fVar51 * 32.0 + fVar38 + fVar56;
                *(float *)(pauVar29[-5] + 8) = fVar64 + fVar47 * 32.0 + fVar39 + fVar58;
                *(float *)(pauVar29[-5] + 0xc) = fVar65 + fVar53 * 32.0 + fVar40 + fVar60;
                pauVar29[-3] = auVar61;
                *(float *)pauVar29[-1] = fVar62 * 16.0 + fVar48 + fVar48 + fVar36;
                *(float *)(pauVar29[-1] + 4) = fVar63 * 16.0 + fVar51 + fVar51 + fVar38;
                *(float *)(pauVar29[-1] + 8) = fVar64 * 16.0 + fVar47 + fVar47 + fVar39;
                *(float *)(pauVar29[-1] + 0xc) = fVar65 * 16.0 + fVar53 + fVar53 + fVar40;
                fVar56 = auVar3._0_4_;
                fVar58 = auVar3._4_4_;
                fVar60 = auVar3._8_4_;
                fVar36 = auVar3._12_4_;
                auVar37._0_4_ = fVar49 + fVar41 + fVar41 + fVar56 * 16.0;
                auVar37._4_4_ = fVar52 + fVar43 + fVar43 + fVar58 * 16.0;
                auVar37._8_4_ = fVar50 + fVar44 + fVar44 + fVar60 * 16.0;
                auVar37._12_4_ = fVar54 + fVar45 + fVar45 + fVar36 * 16.0;
                auVar42._0_4_ = fVar49 + fVar41 * 8.0 + fVar56 * 4.0;
                auVar42._4_4_ = fVar52 + fVar43 * 8.0 + fVar58 * 4.0;
                auVar42._8_4_ = fVar50 + fVar44 * 8.0 + fVar60 * 4.0;
                auVar42._12_4_ = fVar54 + fVar45 * 8.0 + fVar36 * 4.0;
                auVar46._0_4_ = fVar41 * 32.0 + fVar49 + fVar6 + fVar56;
                auVar46._4_4_ = fVar43 * 32.0 + fVar52 + fVar55 + fVar58;
                auVar46._8_4_ = fVar44 * 32.0 + fVar50 + fVar57 + fVar60;
                auVar46._12_4_ = fVar45 * 32.0 + fVar54 + fVar59 + fVar36;
                pauVar29[-4] = auVar37;
                pauVar29[-2] = auVar42;
                *pauVar29 = auVar46;
                lVar28 = lVar28 + 0x80;
                pauVar29 = (undefined1 (*) [16])(*pauVar29 + (long)(iVar25 << 2) * 4);
              } while (lVar28 != 0x370);
              uVar22 = uVar22 + 1;
              lVar27 = lVar27 + 0x10;
            } while (uVar22 != uVar8);
          }
          uVar24 = uVar24 + 1;
          local_510 = local_510 + local_3e8;
          lVar30 = lVar30 + (long)local_4d8.w *
                            CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize) * 6;
        } while (uVar24 != local_3e0);
      }
      uVar24 = local_480 + 1;
      dst = local_488;
      iVar26 = local_4d8.w;
      iVar19 = local_4d8.h;
    } while (local_480 + 1 != local_3f8);
  }
LAB_00255c10:
  copy_cut_border(&local_4d8,dst,0,iVar19 - dst->h,0,iVar26 - dst->w,opt);
  piVar5 = (int *)CONCAT44(local_4d8.refcount._4_4_,local_4d8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_4d8.allocator == (Allocator *)0x0) {
        if (local_4d8.data != (void *)0x0) {
          free(local_4d8.data);
        }
      }
      else {
        (*(local_4d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if ((Allocator *)local_3d8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_3d8._0_8_ != (void *)0x0) {
          free((void *)local_3d8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_3d8._32_8_)[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_388.allocator == (Allocator *)0x0) {
        if (local_388.data != (void *)0x0) {
          free(local_388.data);
        }
      }
      else {
        (*(local_388.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_478.refcount._4_4_,local_478.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_478.allocator == (Allocator *)0x0) {
        if (local_478.data != (void *)0x0) {
          free(local_478.data);
        }
      }
      else {
        (*(local_478.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}